

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_cpc.cpp
# Opt level: O2

void dirSAVECDTFull(path *cdtname)

{
  bool bVar1;
  byte *palette_00;
  long lVar2;
  byte screenMode;
  bool opt [19];
  aint args [19];
  byte abStack_2a [2];
  byte palette [17];
  
  args[2] = 0;
  args[3] = 0;
  args[0x10] = 0;
  args[0x11] = 0;
  args[0x12] = 0;
  args[0xc] = 0;
  args[0xd] = 0;
  args[0xe] = 0;
  args[0xf] = 0;
  args[8] = 0;
  args[9] = 0;
  args[10] = 0;
  args[0xb] = 0;
  args[4] = 0;
  args[5] = 0;
  args[6] = 0;
  args[7] = 0;
  args[0] = StartAddress;
  args[1] = 0xff;
  opt[0] = false;
  opt[1] = true;
  opt[2] = true;
  opt[3] = true;
  opt[4] = true;
  opt[5] = true;
  opt[6] = true;
  opt[7] = true;
  opt[8] = true;
  opt[9] = true;
  opt[10] = true;
  opt[0xb] = true;
  opt[0xc] = true;
  opt[0xd] = true;
  opt[0xe] = true;
  opt[0xf] = true;
  opt[0x10] = true;
  opt[0x11] = true;
  opt[0x12] = true;
  bVar1 = anyComma(&lp);
  if (bVar1) {
    bVar1 = getIntArguments<19>(&lp,&args,&opt);
    if (!bVar1) {
      Error("[SAVECDT] Invalid args. SAVECDT FULL <cdtname>[,<startaddr>[,<screenmode>[,<border>[,<ink0>...<ink15>]]]]"
            ,lp,SUPPRESS);
      return;
    }
    if (args[1] != 0xff) {
      for (lVar2 = 2; lVar2 != 0x13; lVar2 = lVar2 + 1) {
        abStack_2a[lVar2] = (byte)args[lVar2];
      }
      screenMode = (byte)args[1];
      palette_00 = palette;
      goto LAB_00111e6e;
    }
  }
  palette_00 = "\x01\x01\x18\x14\x06\x1a";
  screenMode = '\x01';
LAB_00111e6e:
  SaveCDT_SnapshotWithPalette(cdtname,args[0],screenMode,palette_00);
  return;
}

Assistant:

static void dirSAVECDTFull(const std::filesystem::path & cdtname) {
	constexpr const char* argerr = "[SAVECDT] Invalid args. SAVECDT FULL <cdtname>[,<startaddr>[,<screenmode>[,<border>[,<ink0>...<ink15>]]]]";

	aint args[] = {
		StartAddress,
		0xFF, 0, // mode, border
		0, 0, 0, 0, 0, 0, 0, 0, // palette
		0, 0, 0, 0, 0, 0, 0, 0,
	};

	bool opt[] = {
		false,	// this is used only when comma was parsed after cdtname => not optional then
		true, true,
		true, true, true, true, true, true, true, true,
		true, true, true, true, true, true, true, true,
	};

	if (anyComma(lp) && !getIntArguments<19>(lp, args, opt)) {
		Error(argerr, lp, SUPPRESS); return;
	}

	if (args[1] != 0xFF) {
		byte palette[17];
		for (aint i = 0; i < 17; ++i) {
			palette[i] = args[2 + i];
		}

		SaveCDT_SnapshotWithPalette(cdtname, args[0], args[1], palette);
	}
	else {
		SaveCDT_Snapshot(cdtname, args[0]);
	}
}